

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dict.cpp
# Opt level: O1

MDDEntry * __thiscall ASDCP::Dictionary::FindSymbol(Dictionary *this,string *str)

{
  const_iterator cVar1;
  ILogSink *this_00;
  MDDEntry *pMVar2;
  
  if (*this->m_MDD_Table[0].name != '\0') {
    cVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            ::find(&(this->m_md_sym_lookup)._M_t,str);
    if ((_Rb_tree_header *)cVar1._M_node ==
        &(this->m_md_sym_lookup)._M_t._M_impl.super__Rb_tree_header) {
      this_00 = (ILogSink *)Kumu::DefaultLogSink();
      pMVar2 = (MDDEntry *)0x0;
      Kumu::ILogSink::Warn(this_00,"UL Dictionary: unknown symbol: %s\n",(str->_M_dataplus)._M_p);
    }
    else {
      pMVar2 = this->m_MDD_Table + cVar1._M_node[2]._M_color;
    }
    return pMVar2;
  }
  __assert_fail("m_MDD_Table[0].name[0]",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Dict.cpp"
                ,0x16e,
                "const ASDCP::MDDEntry *ASDCP::Dictionary::FindSymbol(const std::string &) const");
}

Assistant:

const ASDCP::MDDEntry*
ASDCP::Dictionary::FindSymbol(const std::string& str) const
{
  assert(m_MDD_Table[0].name[0]);
  std::map<std::string, ui32_t>::const_iterator i = m_md_sym_lookup.find(str);
  
  if ( i == m_md_sym_lookup.end() )
    {
      Kumu::DefaultLogSink().Warn("UL Dictionary: unknown symbol: %s\n", str.c_str());
      return 0;
    }

  return &m_MDD_Table[i->second];
}